

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

bool __thiscall
DynamicProfileStorageReaderWriter::WriteUtf8String
          (DynamicProfileStorageReaderWriter *this,char16 *str)

{
  bool bVar1;
  size_t sVar2;
  utf8char_t *dest;
  ulong byteSize;
  uint cchSource;
  uint local_34 [2];
  DWORD cbNeeded;
  
  sVar2 = PAL_wcslen(str);
  cchSource = (uint)sVar2;
  if (cchSource < 0x55555556) {
    byteSize = (ulong)(cchSource * 3);
    dest = (utf8char_t *)
           Memory::NoCheckHeapAllocator::Alloc
                     ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,byteSize);
    if (dest == (utf8char_t *)0x0) {
      bVar1 = false;
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory writing to file \'%s\'\n",
                    this->filename);
      Output::Flush();
    }
    else {
      sVar2 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,str,cchSource);
      local_34[0] = (uint)sVar2;
      bVar1 = WriteArray<unsigned_int_const>(this,local_34,1);
      if (bVar1) {
        bVar1 = WriteArray<unsigned_char>(this,dest,(ulong)local_34[0]);
      }
      else {
        bVar1 = false;
      }
      Memory::NoCheckHeapAllocator::Free
                ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,dest,byteSize);
    }
    return bVar1;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

bool DynamicProfileStorageReaderWriter::WriteUtf8String(char16 const * str)
{
    charcount_t len = static_cast<charcount_t>(wcslen(str));
    const size_t cbTempBuffer = UInt32Math::Mul<3>(len);
    utf8char_t * tempBuffer = NoCheckHeapNewArray(utf8char_t, cbTempBuffer);
    if (tempBuffer == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory writing to file '%s'\n"), filename);
        Output::Flush();
        return false;
    }
    DWORD cbNeeded = (DWORD)utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(tempBuffer, cbTempBuffer, str, len);
    bool success = Write(cbNeeded) && WriteArray(tempBuffer, cbNeeded);
    NoCheckHeapDeleteArray(cbTempBuffer, tempBuffer);
    return success;
}